

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

VarValue *
deqp::gles2::Functional::generateZeroVarValue(VarValue *__return_storage_ptr__,DataType type)

{
  int i;
  uint uVar1;
  long lVar2;
  size_t __n;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if (((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) ||
     (type - TYPE_INT < 4)) {
    if ((int)uVar1 < 1) {
      return __return_storage_ptr__;
    }
    __n = (ulong)uVar1 << 2;
  }
  else {
    if (3 < type - TYPE_BOOL) {
      if (0x1d < type - TYPE_SAMPLER_1D) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->val).floatV[0] = 0.0;
      lVar2 = 0;
      do {
        *(float *)((long)&__return_storage_ptr__->val + lVar2 * 4 + 4) = (float)(int)lVar2 * 0.12;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      return __return_storage_ptr__;
    }
    if ((int)uVar1 < 1) {
      return __return_storage_ptr__;
    }
    __n = (size_t)uVar1;
  }
  memset(&__return_storage_ptr__->val,0,__n);
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateZeroVarValue (const glu::DataType type)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = 0.0f;
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = 0;
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = false;
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = 0;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = 0.12f * (float)i;
	}
	else
		DE_ASSERT(false);

	return result;
}